

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP3Reader::~BP3Reader(BP3Reader *this)

{
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP3Reader_0086bb88;
  (this->super_Engine).m_IsOpen = false;
  (this->m_SubFileManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0086b9b8;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_SubFileManager).m_Transports._M_h);
  (this->m_FileManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0086b9b8;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileManager).m_Transports._M_h);
  adios2::format::BP3Deserializer::~BP3Deserializer
            (&this->m_BP3Deserializer,&adios2::format::BP3Deserializer::VTT);
  adios2::format::BPBase::~BPBase((BPBase *)&(this->m_BP3Deserializer).field_0x88);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

BP3Reader::~BP3Reader()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}